

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall google::protobuf::RepeatedField<long>::UnpoisonBuffer(RepeatedField<long> *this)

{
  int old_size;
  int new_size;
  
  old_size = size(this);
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    new_size = 1;
  }
  else {
    new_size = (this->soo_rep_).field_0.long_rep.capacity;
  }
  AnnotateSize(this,old_size,new_size);
  return;
}

Assistant:

void UnpoisonBuffer() const {
    AnnotateSize(size(), Capacity());
    if (is_soo()) {
      // We need to manually unpoison the SOO buffer because in reflection for
      // split repeated fields, we poison the whole SOO buffer even when we
      // don't actually use the whole SOO buffer (e.g. for RepeatedField<bool>).
      PROTOBUF_UNPOISON_MEMORY_REGION(soo_rep_.short_rep.data,
                                      sizeof(soo_rep_.short_rep.data));
    }
  }